

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

void * HokuyoThread(void *pParam)

{
  int iVar1;
  double local_8038;
  double distances [2048];
  double angles [2048];
  int local_2c;
  int err;
  int res;
  int id;
  HOKUYO *pHokuyo;
  void *pParam_local;
  
  err = 0;
  local_2c = 0;
  do {
    if (addrsHokuyo[err] == pParam) {
      do {
        memset(&local_8038,0,0x4000);
        memset(distances + 0x7ff,0,0x4000);
        iVar1 = GetLatestDataHokuyo((HOKUYO *)pParam,&local_8038,distances + 0x7ff);
        if (iVar1 != 0) {
          local_2c = iVar1;
        }
        EnterCriticalSection(HokuyoCS + err);
        memcpy(distancesHokuyo + err,&local_8038,0x4000);
        memcpy(anglesHokuyo + err,distances + 0x7ff,0x4000);
        resHokuyo[err] = local_2c;
        LeaveCriticalSection(HokuyoCS + err);
      } while (bExitHokuyo[err] == 0);
      return (void *)0x0;
    }
    err = err + 1;
  } while (err < 0x10);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE HokuyoThread(void* pParam)
{
	HOKUYO* pHokuyo = (HOKUYO*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	double angles[MAX_SLITDIVISION_HOKUYO];
	double distances[MAX_SLITDIVISION_HOKUYO];

	while (addrsHokuyo[id] != pHokuyo)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	for (;;)
	{
		//mSleep(pHokuyo->threadperiod);
		memset(distances, 0, MAX_SLITDIVISION_HOKUYO*sizeof(double));
		memset(angles, 0, MAX_SLITDIVISION_HOKUYO*sizeof(double));
		res = GetLatestDataHokuyo(pHokuyo, distances, angles);
		if (res != EXIT_SUCCESS) err = res;
		// if (GetLatestDataHokuyo(pHokuyo, distances, angles) == EXIT8SUCCESS)
		{
			EnterCriticalSection(&HokuyoCS[id]);
			memcpy(distancesHokuyo[id], distances, MAX_SLITDIVISION_HOKUYO*sizeof(double));
			memcpy(anglesHokuyo[id], angles, MAX_SLITDIVISION_HOKUYO*sizeof(double));
			resHokuyo[id] = err;
			LeaveCriticalSection(&HokuyoCS[id]);
		}
		if (bExitHokuyo[id]) break;
	}

	return 0;
}